

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpsources.cpp
# Opt level: O0

int __thiscall
jrtplib::RTPSources::ObtainSourceDataInstance
          (RTPSources *this,uint32_t ssrc,RTPInternalSourceData **srcdat,bool *created)

{
  ProbationType probtype;
  uint32_t ssrc_00;
  int iVar1;
  RTPMemoryManager *pRVar2;
  RTPInternalSourceData *pRVar3;
  RTPInternalSourceData **ppRVar4;
  RTPInternalSourceData *pRStack_38;
  int status;
  RTPInternalSourceData *srcdat2;
  bool *created_local;
  RTPInternalSourceData **srcdat_local;
  RTPSources *pRStack_18;
  uint32_t ssrc_local;
  RTPSources *this_local;
  
  srcdat2 = (RTPInternalSourceData *)created;
  created_local = (bool *)srcdat;
  srcdat_local._4_4_ = ssrc;
  pRStack_18 = this;
  iVar1 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
          ::GotoElement(&this->sourcelist,(uint *)((long)&srcdat_local + 4));
  if (iVar1 < 0) {
    pRVar2 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    pRVar3 = (RTPInternalSourceData *)operator_new(0x280,pRVar2,0x18);
    ssrc_00 = srcdat_local._4_4_;
    probtype = this->probationtype;
    pRVar2 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
    RTPInternalSourceData::RTPInternalSourceData(pRVar3,ssrc_00,probtype,pRVar2);
    if (pRVar3 == (RTPInternalSourceData *)0x0) {
      return -1;
    }
    pRStack_38 = pRVar3;
    iVar1 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
            ::AddElement(&this->sourcelist,(uint *)((long)&srcdat_local + 4),
                         &stack0xffffffffffffffc8);
    pRVar3 = pRStack_38;
    if (iVar1 < 0) {
      pRVar2 = RTPMemoryObject::GetMemoryManager(&this->super_RTPMemoryObject);
      RTPDelete<jrtplib::RTPInternalSourceData>(pRVar3,pRVar2);
      return iVar1;
    }
    *(RTPInternalSourceData **)created_local = pRStack_38;
    *(undefined1 *)&(srcdat2->super_RTPSourceData).super_RTPMemoryObject._vptr_RTPMemoryObject = 1;
    this->totalcount = this->totalcount + 1;
  }
  else {
    ppRVar4 = RTPKeyHashTable<const_unsigned_int,_jrtplib::RTPInternalSourceData_*,_jrtplib::RTPSources_GetHashIndex,_8317>
              ::GetCurrentElement(&this->sourcelist);
    *(RTPInternalSourceData **)created_local = *ppRVar4;
    *(undefined1 *)&(srcdat2->super_RTPSourceData).super_RTPMemoryObject._vptr_RTPMemoryObject = 0;
  }
  return 0;
}

Assistant:

int RTPSources::ObtainSourceDataInstance(uint32_t ssrc,RTPInternalSourceData **srcdat,bool *created)
{
	RTPInternalSourceData *srcdat2;
	int status;
	
	if (sourcelist.GotoElement(ssrc) < 0) // No entry for this source
	{
#ifdef RTP_SUPPORT_PROBATION
		srcdat2 = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPINTERNALSOURCEDATA) RTPInternalSourceData(ssrc,probationtype,GetMemoryManager());
#else
		srcdat2 = RTPNew(GetMemoryManager(),RTPMEM_TYPE_CLASS_RTPINTERNALSOURCEDATA) RTPInternalSourceData(ssrc,RTPSources::NoProbation,GetMemoryManager());
#endif // RTP_SUPPORT_PROBATION
		if (srcdat2 == 0)
			return ERR_RTP_OUTOFMEM;
		if ((status = sourcelist.AddElement(ssrc,srcdat2)) < 0)
		{
			RTPDelete(srcdat2,GetMemoryManager());
			return status;
		}
		*srcdat = srcdat2;
		*created = true;
		totalcount++;
	}
	else
	{
		*srcdat = sourcelist.GetCurrentElement();
		*created = false;
	}
	return 0;
}